

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall chaiscript::parser::ChaiScript_Parser::Map_Pair(ChaiScript_Parser *this)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  eval_error *this_00;
  long lVar5;
  bool bVar6;
  Position prev_pos;
  allocator local_89;
  undefined8 local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  string local_60;
  File_Position local_40;
  string local_38;
  
  lVar5 = (long)(this->m_match_stack).
                super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_match_stack).
                super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_88._0_4_ = (this->m_position).line;
  local_88._4_4_ = (this->m_position).col;
  pcVar1 = (this->m_position).m_pos._M_current;
  pcVar2 = (this->m_position).m_end._M_current;
  uVar3 = *(undefined8 *)&(this->m_position).m_last_col;
  local_78 = SUB84(pcVar2,0);
  uStack_74 = (undefined4)((ulong)pcVar2 >> 0x20);
  uStack_70 = (undefined4)uVar3;
  uStack_6c = (undefined4)((ulong)uVar3 >> 0x20);
  uStack_80 = SUB84(pcVar1,0);
  uStack_7c = (undefined4)((ulong)pcVar1 >> 0x20);
  bVar6 = false;
  bVar4 = Operator(this,0);
  if (bVar4) {
    bVar4 = Symbol(this,":",false,false);
    if (bVar4) {
      bVar4 = Operator(this,0);
      if (!bVar4) {
        this_00 = (eval_error *)__cxa_allocate_exception(0x90);
        std::__cxx11::string::string((string *)&local_38,"Incomplete map pair",&local_89);
        local_40.line = (this->m_position).line;
        local_40.column = (this->m_position).col;
        exception::eval_error::eval_error
                  (this_00,&local_38,&local_40,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      std::__cxx11::string::string((string *)&local_60,"",(allocator *)&local_38);
      build_match<chaiscript::eval::Map_Pair_AST_Node>(this,lVar5 >> 4,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      bVar6 = true;
    }
    else {
      *(ulong *)((long)&(this->m_position).m_pos._M_current + 4) = CONCAT44(local_78,uStack_7c);
      *(ulong *)((long)&(this->m_position).m_end._M_current + 4) = CONCAT44(uStack_70,uStack_74);
      (this->m_position).line = (undefined4)local_88;
      (this->m_position).col = local_88._4_4_;
      (this->m_position).m_pos._M_current = (char *)CONCAT44(uStack_7c,uStack_80);
      while (lVar5 != (long)(this->m_match_stack).
                            super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_match_stack).
                            super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) {
        std::
        vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
        ::pop_back(&this->m_match_stack);
      }
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool Map_Pair() {
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();
        const auto prev_pos = m_position;

        if (Operator()) {
          if (Symbol(":")) {
            retval = true;
            if (!Operator()) {
              throw exception::eval_error("Incomplete map pair", File_Position(m_position.line, m_position.col), *m_filename);
            }

            build_match<eval::Map_Pair_AST_Node>(prev_stack_top);
          }
          else {
            m_position = prev_pos;
            while (prev_stack_top != m_match_stack.size()) {
              m_match_stack.pop_back();
            }
          }
        }

        return retval;
      }